

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O0

void doFormatString<unsigned_char_const>(wstringstream *stream,wchar_t *format,uchar *first)

{
  wchar_t wVar1;
  bool bVar2;
  uchar *first_local;
  wchar_t *format_local;
  wstringstream *stream_local;
  
  first_local = (uchar *)format;
  format_local = (wchar_t *)stream;
  while( true ) {
    if (*(int *)first_local == 0) {
      return;
    }
    if (*(int *)first_local == 0x25) break;
    wVar1 = *(wchar_t *)first_local;
    first_local = first_local + 4;
    std::operator<<((wostream *)(format_local + 4),wVar1);
  }
  first_local = first_local + 4;
  bVar2 = doFormatSetup((wstringstream *)format_local,(wchar_t **)&first_local);
  if (bVar2) {
    std::wostream::operator<<((wostream *)(format_local + 4),(uint)*first);
  }
  doFormatString((wstringstream *)format_local,(wchar_t *)first_local);
  return;
}

Assistant:

void doFormatString(std::wstringstream& stream, const wchar_t* format, First& first, const Rest&... rest)
{
	while (*format != 0)
	{
		if (*format == '%')
		{
			format++;
			if (doFormatSetup(stream,format))
				stream << first;
			doFormatString(stream,format,rest...);
			return;
		}

		stream << *format++;
	}
}